

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sundials_dense.c
# Opt level: O1

void SUNDlsMat_denseGETRS(realtype **a,sunindextype n,sunindextype *p,realtype *b)

{
  realtype rVar1;
  uint uVar2;
  realtype *prVar3;
  bool bVar4;
  ulong uVar5;
  long lVar6;
  ulong uVar7;
  realtype *prVar8;
  ulong uVar9;
  ulong uVar10;
  
  uVar7 = (ulong)(uint)n;
  if (0 < n) {
    uVar5 = 0;
    do {
      uVar2 = p[uVar5];
      if (uVar5 != uVar2) {
        rVar1 = b[uVar5];
        b[uVar5] = b[(int)uVar2];
        b[(int)uVar2] = rVar1;
      }
      uVar5 = uVar5 + 1;
    } while (uVar7 != uVar5);
  }
  if (1 < n) {
    lVar6 = 0;
    prVar8 = b;
    uVar5 = 0;
    do {
      uVar9 = uVar5 + 1;
      prVar3 = a[uVar5];
      uVar10 = 1;
      do {
        prVar8[uVar10] = prVar8[uVar10] - *(double *)((long)prVar3 + uVar10 * 8 + lVar6) * b[uVar5];
        uVar10 = uVar10 + 1;
      } while (uVar7 != uVar10);
      prVar8 = prVar8 + 1;
      lVar6 = lVar6 + 8;
      uVar7 = uVar7 - 1;
      uVar5 = uVar9;
    } while (uVar9 != n - 1);
  }
  uVar7 = (ulong)(n - 1);
  if (1 < n) {
    do {
      prVar8 = a[uVar7];
      b[uVar7] = b[uVar7] / prVar8[uVar7];
      uVar5 = 0;
      do {
        b[uVar5] = b[uVar5] - prVar8[uVar5] * b[uVar7];
        uVar5 = uVar5 + 1;
      } while (uVar7 != uVar5);
      bVar4 = 1 < (long)uVar7;
      uVar7 = uVar7 - 1;
    } while (bVar4);
  }
  *b = *b / **a;
  return;
}

Assistant:

void SUNDlsMat_denseGETRS(realtype **a, sunindextype n, sunindextype *p, realtype *b)
{
  sunindextype i, k, pk;
  realtype *col_k, tmp;

  /* Permute b, based on pivot information in p */
  for (k=0; k<n; k++) {
    pk = p[k];
    if(pk != k) {
      tmp = b[k];
      b[k] = b[pk];
      b[pk] = tmp;
    }
  }

  /* Solve Ly = b, store solution y in b */
  for (k=0; k<n-1; k++) {
    col_k = a[k];
    for (i=k+1; i<n; i++) b[i] -= col_k[i]*b[k];
  }

  /* Solve Ux = y, store solution x in b */
  for (k = n-1; k > 0; k--) {
    col_k = a[k];
    b[k] /= col_k[k];
    for (i=0; i<k; i++) b[i] -= col_k[i]*b[k];
  }
  b[0] /= a[0][0];

}